

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::x86::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  FuncValue *arg;
  undefined8 *puVar1;
  uint uVar2;
  OperandPack *pOVar3;
  BaseBuilder *pBVar4;
  BaseEmitter *this_00;
  Error EVar5;
  Error EVar6;
  char cVar7;
  Error EVar8;
  Error EVar9;
  undefined8 extraout_RAX;
  uint uVar10;
  long lVar11;
  InstId IVar12;
  Environment EVar13;
  Environment invokeNode_00;
  undefined1 *puVar14;
  long lVar15;
  ulong uVar16;
  int iVar17;
  Imm *imm_;
  Error unaff_R14D;
  long lVar18;
  bool bVar19;
  Reg dst;
  RAWorkReg *workReg;
  RAWorkReg *workReg_1;
  Error local_98;
  Operand_ local_68;
  Operand_ local_58;
  RAWorkReg *local_48;
  FuncValue *local_40;
  ulong local_38;
  
  local_38 = (ulong)(byte)invokeNode->field_0xf4;
  lVar15 = *(long *)(this + 8);
  EVar13._1_7_ = (undefined7)((ulong)invokeNode >> 8);
  *(undefined8 *)(lVar15 + 0x198) = *(undefined8 *)invokeNode;
  if (local_38 == 0) {
    bVar19 = true;
    local_98 = unaff_R14D;
  }
  else {
    EVar13._arch = *(byte *)(lVar15 + 0x50) >> 3;
    puVar14 = &invokeNode->field_0x11c;
    lVar15 = 0;
    uVar16 = 0;
    invokeNode_00 = EVar13;
    do {
      if (uVar16 == 0x20) {
LAB_0014a30a:
        onBeforeInvoke();
LAB_0014a30f:
        onBeforeInvoke();
        goto LAB_0014a314;
      }
      lVar11 = 0;
      lVar18 = lVar15;
      do {
        EVar9 = 5;
        if (*(uint *)(puVar14 + lVar11) == 0) break;
        if ((byte)invokeNode->field_0xf4 <= (byte)uVar16) {
          onBeforeInvoke();
          goto LAB_0014a30a;
        }
        pOVar3 = invokeNode->_args;
        uVar10 = *(uint *)((long)pOVar3->_data[0]._data + lVar11 * 4 + lVar15 + -8);
        if (uVar10 == 0) {
          EVar9 = 7;
        }
        else {
          arg = (FuncValue *)(puVar14 + lVar11);
          imm_ = (Imm *)((long)pOVar3->_data[0]._data + lVar18 + -8);
          uVar10 = uVar10 & 7;
          EVar6 = local_98;
          if (uVar10 == 4) {
            if ((*(uint *)(puVar14 + lVar11) >> 8 & 1) == 0) {
              EVar8 = moveImmToStackArg(this,(InvokeNode *)invokeNode_00,arg,imm_);
              EVar9 = 1;
              EVar5 = EVar8;
              goto joined_r0x00149c67;
            }
            local_68._signature._bits = 1;
            local_68._baseId = 0xff;
            local_68._data[0] = 0;
            local_68._data[1] = 0;
            EVar8 = moveImmToRegArg(this,(InvokeNode *)invokeNode_00,arg,imm_,(BaseReg *)&local_68);
            if (EVar8 == 0) {
              puVar1 = (undefined8 *)
                       ((long)invokeNode->_args->_data[0]._data + lVar11 * 4 + lVar15 + -8);
              *puVar1 = CONCAT44(local_68._baseId,local_68._signature._bits);
              puVar1[1] = CONCAT44(local_68._data[1],local_68._data[0]);
              goto LAB_00149c85;
            }
            EVar9 = 1;
            local_98 = EVar8;
          }
          else {
            if (uVar10 == 1) {
              uVar10 = *(int *)((long)pOVar3->_data[0]._data + lVar11 * 4 + lVar15 + -4) - 0x100;
              pBVar4 = ((*(BaseRAPass **)this)->super_FuncPass).super_Pass._cb;
              if (uVar10 < *(uint *)&pBVar4[1].super_BaseEmitter._logger) {
                invokeNode_00 = (&(pBVar4[1].super_BaseEmitter._code)->_environment)[uVar10];
                local_58._0_8_ = *(undefined8 *)((long)invokeNode_00 + 0x28);
                EVar8 = 0;
                if (local_58._0_8_ == 0) {
                  EVar8 = BaseRAPass::_asWorkReg
                                    (*(BaseRAPass **)this,(VirtReg *)invokeNode_00,
                                     (RAWorkReg **)&local_58);
                }
              }
              else {
                EVar8 = 0x1e;
              }
              EVar9 = 1;
              EVar6 = EVar8;
              EVar5 = EVar9;
              if (EVar8 == 0) {
                uVar10 = arg->_data;
                if ((uVar10 >> 8 & 1) == 0) {
                  if ((uVar10 >> 10 & 1) == 0) {
                    EVar8 = moveRegToStackArg(this,(InvokeNode *)invokeNode_00,arg,(BaseReg *)imm_);
                  }
                  else {
                    uVar10 = *(uint *)((long)pOVar3->_data[0]._data + lVar11 * 4 + lVar15 + -8);
                    if ((uVar10 & 0xf00) == 0) {
                      EVar8 = 0x19;
                      EVar6 = 0x19;
                      if (EVar13._arch == (Arch)(uVar10 >> 3)) {
                        EVar8 = moveRegToStackArg(this,(InvokeNode *)invokeNode_00,arg,
                                                  (BaseReg *)imm_);
                        EVar9 = 1;
                        EVar6 = EVar8;
                        EVar5 = EVar9;
                        if (EVar8 == 0) {
                          EVar9 = 7;
                          EVar8 = local_98;
                          EVar6 = local_98;
                          EVar5 = EVar9;
                        }
                      }
                      goto joined_r0x00149c67;
                    }
                    local_68._signature._bits = 1;
                    local_68._baseId = 0xff;
                    local_68._data[0] = 0;
                    local_68._data[1] = 0;
                    invokeNode_00 = (Environment)invokeNode;
                    local_40 = arg;
                    moveVecToPtr(this,invokeNode,arg,(Vec *)imm_,(BaseReg *)&local_68);
                    EVar8 = moveRegToStackArg(this,(InvokeNode *)invokeNode_00,local_40,
                                              (BaseReg *)&local_68);
                  }
                  EVar6 = EVar8;
                  if (EVar8 != 0) goto joined_r0x00149c67;
                }
                else {
                  if (0x1fffffff < uVar10) goto LAB_0014a30f;
                  if ((uVar10 >> 10 & 1) == 0) {
                    if (((*(uint *)(local_58._0_8_ + 0x20) ^
                         *(uint *)(_archTraits + (ulong)(uVar10 >> 0x18) * 4 + 0xec)) & 0xf00) != 0)
                    {
                      local_98 = 0x19;
                      goto LAB_00149f0b;
                    }
LAB_00149eec:
                    EVar9 = 0;
                    bVar19 = true;
                  }
                  else {
                    uVar10 = *(uint *)((long)pOVar3->_data[0]._data + lVar11 * 4 + lVar15 + -8);
                    if ((uVar10 & 0xf00) != 0) {
                      local_68._signature._bits = 1;
                      local_68._baseId = 0xff;
                      local_68._data[0] = 0;
                      local_68._data[1] = 0;
                      invokeNode_00 = (Environment)invokeNode;
                      moveVecToPtr(this,invokeNode,arg,(Vec *)imm_,(BaseReg *)&local_68);
                      puVar1 = (undefined8 *)
                               ((long)invokeNode->_args->_data[0]._data + lVar11 * 4 + lVar15 + -8);
                      *puVar1 = CONCAT44(local_68._baseId,local_68._signature._bits);
                      puVar1[1] = CONCAT44(local_68._data[1],local_68._data[0]);
                      goto LAB_00149eec;
                    }
                    EVar9 = 1;
                    if (EVar13._arch == (Arch)(uVar10 >> 3)) {
                      EVar9 = 7;
                    }
                    else {
                      local_98 = 0x19;
                    }
LAB_00149f0b:
                    bVar19 = false;
                  }
                  EVar8 = local_98;
                  EVar6 = local_98;
                  EVar5 = EVar9;
                  if (!bVar19) goto joined_r0x00149c67;
                }
                EVar9 = 0;
                EVar8 = local_98;
                EVar6 = local_98;
                EVar5 = EVar9;
              }
joined_r0x00149c67:
              local_98 = EVar8;
              if (EVar5 != 0) goto LAB_00149c87;
            }
LAB_00149c85:
            local_98 = EVar6;
            EVar9 = 0;
          }
        }
LAB_00149c87:
        if ((EVar9 != 7) && (EVar9 != 0)) break;
        lVar11 = lVar11 + 4;
        lVar18 = lVar18 + 0x10;
        EVar9 = 5;
      } while (lVar11 != 0x10);
      if (EVar9 == 5) {
        EVar9 = 0;
      }
      if (EVar9 != 0) goto LAB_00149f60;
      uVar16 = uVar16 + 1;
      puVar14 = puVar14 + 0x10;
      lVar15 = lVar15 + 0x40;
    } while (uVar16 != local_38);
    EVar9 = 2;
LAB_00149f60:
    bVar19 = EVar9 == 2;
  }
  if (bVar19) {
    this_00 = *(BaseEmitter **)(this + 8);
    this_00[2]._funcs.emitArgsAssignment = (EmitArgsAssignment)invokeNode;
    if (((invokeNode->field_0x88 & 1) != 0) && (*(uint *)&invokeNode->field_0x108 != 0)) {
      local_68._signature._bits = (this_00->_gpSignature)._bits;
      local_68._baseId = 4;
      local_68._data[0] = 0;
      local_68._data[1] = 0;
      local_58._signature._bits = 4;
      local_58._baseId = 0;
      local_58._data[1] = 0;
      local_58._data[0] = *(uint *)&invokeNode->field_0x108;
      EVar9 = BaseEmitter::_emitI(this_00,0x311,&local_68,&local_58);
      if (EVar9 != 0) {
        return EVar9;
      }
    }
    if (*(int *)&invokeNode->field_0x10c != 0) {
      lVar15 = 199;
      do {
        EVar9 = local_98;
        if (*(int *)(&invokeNode->field_0x45 + lVar15) == 0) {
          iVar17 = 0x16;
        }
        else {
          iVar17 = 0;
          if ((*(uint *)(&invokeNode->super_InstNodeWithOperands<4U> + lVar15 * 4) & 7) == 1) {
            uVar10 = *(int *)(&invokeNode->field_0x4 + lVar15 * 4) - 0x100;
            pBVar4 = ((*(BaseRAPass **)this)->super_FuncPass).super_Pass._cb;
            if (uVar10 < *(uint *)&pBVar4[1].super_BaseEmitter._logger) {
              EVar13 = (&(pBVar4[1].super_BaseEmitter._code)->_environment)[uVar10];
              local_48 = *(RAWorkReg **)((long)EVar13 + 0x28);
              EVar9 = 0;
              if (local_48 == (RAWorkReg *)0x0) {
                EVar9 = BaseRAPass::_asWorkReg(*(BaseRAPass **)this,(VirtReg *)EVar13,&local_48);
              }
            }
            else {
              EVar9 = 0x1e;
            }
            iVar17 = 1;
            if (EVar9 == 0) {
              uVar10 = *(uint *)(&invokeNode->field_0x45 + lVar15);
              if ((uVar10 >> 8 & 1) == 0) {
LAB_0014a084:
                iVar17 = 0;
                EVar9 = local_98;
              }
              else if (uVar10 >> 0x18 == 0x16) {
                uVar2 = *(uint *)(local_48 + 0x20);
                if ((uVar2 & 0xf00) == 0x100) {
                  local_68._baseId = *(uint32_t *)(local_48 + 4);
                  local_68._data[0] = 0;
                  local_68._data[1] = 0;
                  local_58._signature._bits = 2;
                  local_58._baseId = 0;
                  local_58._data[0] = 0;
                  local_58._data[1] = 0;
                  cVar7 = (char)uVar10;
                  if ((char)uVar10 == '\0') {
                    cVar7 = TypeUtils::_typeData[*(byte *)(*(long *)(local_48 + 8) + 0xd)];
                  }
                  local_68._signature._bits = uVar2;
                  if (cVar7 == '+') {
                    EVar9 = BaseRAPass::useTemporaryMem
                                      (*(BaseRAPass **)this,(BaseMem *)&local_58,8,4);
                    if (EVar9 == 0) {
                      local_58._signature._bits._3_1_ = 8;
                      EVar9 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x103,&local_58);
                      if (EVar9 == 0) {
                        IVar12 = 0x4c1;
                        if (this[0x292] == (RACFGBuilder)0x0) {
                          IVar12 = 0x1d6;
                        }
                        EVar9 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar12,&local_68,
                                                    &local_58);
LAB_0014a275:
                        if (EVar9 == 0) {
                          bVar19 = true;
                          goto LAB_0014a287;
                        }
                      }
                      goto LAB_0014a27d;
                    }
LAB_0014a208:
                    local_98 = EVar9;
                    bVar19 = false;
                  }
                  else if (cVar7 == '*') {
                    EVar9 = BaseRAPass::useTemporaryMem
                                      (*(BaseRAPass **)this,(BaseMem *)&local_58,4,4);
                    if (EVar9 != 0) goto LAB_0014a208;
                    local_58._signature._bits._3_1_ = 4;
                    EVar9 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),0x103,&local_58);
                    if (EVar9 == 0) {
                      IVar12 = 0x4c5;
                      if (this[0x292] == (RACFGBuilder)0x0) {
                        IVar12 = 0x1d9;
                      }
                      EVar9 = BaseEmitter::_emitI(*(BaseEmitter **)(this + 8),IVar12,&local_68,
                                                  &local_58);
                      goto LAB_0014a275;
                    }
LAB_0014a27d:
                    local_98 = EVar9;
                    bVar19 = false;
                  }
                  else {
                    local_98 = 0x19;
                    bVar19 = false;
                  }
LAB_0014a287:
                  EVar9 = local_98;
                  if (bVar19) goto LAB_0014a084;
                }
                else {
                  EVar9 = 0x19;
                }
              }
              else {
                if (0x1fffffff < uVar10) {
LAB_0014a314:
                  onBeforeInvoke();
                  __clang_call_terminate(extraout_RAX);
                }
                if (((*(uint *)(_archTraits + (ulong)(uVar10 >> 0x18) * 4 + 0xec) ^
                     *(uint *)(local_48 + 0x20)) & 0xf00) == 0) goto LAB_0014a084;
                EVar9 = 0x19;
              }
            }
          }
        }
        local_98 = EVar9;
        if (iVar17 != 0) goto LAB_0014a2b0;
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0xd7);
      iVar17 = 0x16;
LAB_0014a2b0:
      if (iVar17 != 0x16) {
        return local_98;
      }
    }
    *(uint *)(*(long *)(this + 0x10) + 0xc) = *(uint *)(*(long *)(this + 0x10) + 0xc) | 0x1000;
    lVar15 = *(long *)(*(long *)this + 0x98);
    *(uint *)(lVar15 + 0x2d0) = *(uint *)(lVar15 + 0x2d0) | 0x20;
    uVar10 = *(uint *)&invokeNode->field_0x108;
    if (*(uint *)&invokeNode->field_0x108 < *(uint *)(lVar15 + 0x2e0)) {
      uVar10 = *(uint *)(lVar15 + 0x2e0);
    }
    *(uint *)(lVar15 + 0x2e0) = uVar10;
    local_98 = 0;
  }
  return local_98;
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());
  RegType nativeRegType = cc()->_gpSignature.regType();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);
              // It's considered allocated if this is an indirect argument and the user used GP.
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            invokeNode->_args[argIndex][valueIndex] = indirectReg;
          }
          else {
            if (regGroup != argGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
        else {
          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);

              ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, indirectReg));
          }
          else {
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
          }
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);
  if (fd.hasFlag(CallConvFlags::kCalleePopsStack) && fd.argStackSize() != 0)
    ASMJIT_PROPAGATE(cc()->sub(cc()->zsp(), fd.argStackSize()));

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          if (ret.regType() == RegType::kX86_St) {
            if (workReg->group() != RegGroup::kVec)
              return DebugUtils::errored(kErrorInvalidAssignment);

            Reg dst(workReg->signature(), workReg->virtId());
            Mem mem;

            TypeId typeId = TypeUtils::scalarOf(workReg->typeId());
            if (ret.hasTypeId())
              typeId = ret.typeId();

            switch (typeId) {
              case TypeId::kFloat32:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
                mem.setSize(4);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), dst.as<Xmm>(), mem));
                break;

              case TypeId::kFloat64:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
                mem.setSize(8);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), dst.as<Xmm>(), mem));
                break;

              default:
                return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
          else {
            RegGroup regGroup = workReg->group();
            RegGroup retGroup = Reg::groupOf(ret.regType());

            if (regGroup != retGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlockFlags::kHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncAttributes::kHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}